

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

bool doctest::operator>(double lhs,Approx *rhs)

{
  bool bVar1;
  
  if (lhs < rhs->m_value || lhs == rhs->m_value) {
    return false;
  }
  bVar1 = operator==(lhs,rhs);
  return !bVar1;
}

Assistant:

bool operator>(double lhs, const Approx& rhs) { return lhs > rhs.m_value && lhs != rhs; }